

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O1

void __thiscall
Corrade::Utility::ConfigurationGroup::ConfigurationGroup
          (ConfigurationGroup *this,ConfigurationGroup *other)

{
  pointer pGVar1;
  ConfigurationGroup *this_00;
  pointer pGVar2;
  
  std::
  vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
  ::vector(&this->_values,&other->_values);
  std::
  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
  ::vector(&this->_groups,&other->_groups);
  this->_configuration = (Configuration *)0x0;
  pGVar1 = (this->_groups).
           super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pGVar2 = (this->_groups).
                super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                ._M_impl.super__Vector_impl_data._M_start; pGVar2 != pGVar1; pGVar2 = pGVar2 + 1) {
    this_00 = (ConfigurationGroup *)operator_new(0x38);
    ConfigurationGroup(this_00,pGVar2->group);
    pGVar2->group = this_00;
  }
  return;
}

Assistant:

ConfigurationGroup::ConfigurationGroup(const ConfigurationGroup& other): _values(other._values), _groups(other._groups), _configuration(nullptr) {
    /* Deep copy groups */
    for(Group& group: _groups)
        group.group = new ConfigurationGroup(*group.group);
}